

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O0

int __thiscall wabt::string_view::copy(string_view *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  unsigned_long *puVar1;
  ulong in_RCX;
  unsigned_long local_38;
  EVP_PKEY_CTX *local_30;
  size_t count;
  size_type pos_local;
  size_type n_local;
  char *s_local;
  string_view *this_local;
  
  pos_local = (size_type)src;
  n_local = (size_type)dst;
  s_local = (char *)this;
  if (in_RCX <= this->size_) {
    local_38 = this->size_ - in_RCX;
    count = in_RCX;
    puVar1 = std::min<unsigned_long>(&pos_local,&local_38);
    local_30 = (EVP_PKEY_CTX *)*puVar1;
    std::char_traits<char>::copy
              ((char_traits<char> *)n_local,(EVP_PKEY_CTX *)(this->data_ + count),local_30);
    return (int)local_30;
  }
  __assert_fail("pos <= size_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/string-view.cc"
                ,0x37,
                "string_view::size_type wabt::string_view::copy(char *, size_type, size_type) const"
               );
}

Assistant:

string_view::size_type string_view::copy(char* s,
                                         size_type n,
                                         size_type pos) const {
  assert(pos <= size_);
  size_t count = std::min(n, size_ - pos);
  traits_type::copy(s, data_ + pos, count);
  return count;
}